

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_ldf_asi(DisasContext_conflict8 *dc,TCGv_i32 addr,int insn,int size,int rd)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGContext_conflict8 *tcg_ctx_00;
  long lVar1;
  TCGv_i64 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGTemp *pTVar5;
  TCGv_i32 ret;
  long lVar6;
  uintptr_t o_1;
  int iVar7;
  MemOp_conflict1 memop;
  uintptr_t o_3;
  uintptr_t o_2;
  DisasASI DVar8;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx = dc->uc->tcg_ctx;
  DVar8 = get_asi(dc,insn,size == 4 ^ MO_BEQ);
  memop = DVar8.memop;
  iVar7 = DVar8.mem_idx;
  switch(DVar8.type) {
  case GET_ASI_EXCP:
    return;
  case GET_ASI_DIRECT:
    if (dc->address_mask_32bit == true) {
      tcg_gen_andi_i64_sparc64(dc->uc->tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,0xffffffff);
    }
    if (size == 0x10) {
      pTVar5 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I64,false);
      pTVar2 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
      tcg_gen_qemu_ld_i64_sparc64(tcg_ctx,pTVar2,(TCGv_i64)addr,(long)iVar7,memop | MO_ALIGN_4);
      tcg_gen_addi_i64_sparc64(tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,8);
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx,tcg_ctx->cpu_fpr[(ulong)((uint)rd >> 1) + 1],(TCGv_i64)addr,(long)iVar7,
                 memop | MO_ALIGN_4);
      if (tcg_ctx->cpu_fpr[(uint)rd >> 1] != pTVar2) {
        tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,
                            (TCGArg)(tcg_ctx->cpu_fpr[(uint)rd >> 1] + (long)tcg_ctx),(TCGArg)pTVar5
                           );
      }
      pTVar5 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      goto LAB_00a594cd;
    }
    if (size != 8) {
      if (size == 4) {
        pTVar3 = gen_dest_fpr_F(dc);
        tcg_gen_qemu_ld_i32_sparc64(tcg_ctx,pTVar3,(TCGv_i64)addr,(long)iVar7,memop);
        gen_store_fpr_F(dc,rd,pTVar3);
        return;
      }
      iVar7 = 0x9e4;
LAB_00a59681:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                 ,iVar7,(char *)0x0);
    }
    pTVar2 = tcg_ctx->cpu_fpr[(uint)rd >> 1];
    memop = memop | MO_ALIGN_4;
    break;
  default:
    pTVar3 = tcg_const_i32_sparc64(tcg_ctx,DVar8.asi);
    pTVar4 = tcg_const_i32_sparc64(tcg_ctx,memop);
    tcg_ctx_00 = dc->uc->tcg_ctx;
    tcg_gen_op2_sparc64(tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00)
                        ,dc->pc);
    save_npc(dc);
    if (size == 0x10) {
      pTVar5 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I64,false);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = addr + (long)&tcg_ctx->pool_cur;
      local_48 = pTVar3 + (long)tcg_ctx;
      local_40 = pTVar4 + (long)&tcg_ctx->pool_cur;
      tcg_gen_callN_sparc64(tcg_ctx,helper_ld_asi_sparc64,pTVar5,4,&local_58);
      tcg_gen_addi_i64_sparc64(tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,8);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = addr + (long)&tcg_ctx->pool_cur;
      local_48 = pTVar3 + (long)tcg_ctx;
      local_40 = pTVar4 + (long)&tcg_ctx->pool_cur;
      tcg_gen_callN_sparc64
                (tcg_ctx,helper_ld_asi_sparc64,
                 (TCGTemp *)
                 ((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[(ulong)((uint)rd >> 1) + 1]),4,
                 &local_58);
      if (tcg_ctx->cpu_fpr[(uint)rd >> 1] != (TCGv_i64)((long)pTVar5 - (long)tcg_ctx)) {
        tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,
                            (TCGArg)((long)&tcg_ctx->pool_cur +
                                    (long)tcg_ctx->cpu_fpr[(uint)rd >> 1]),(TCGArg)pTVar5);
      }
      tcg_temp_free_internal_sparc64(tcg_ctx,pTVar5);
    }
    else if (size == 8) {
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = addr + (long)tcg_ctx;
      local_48 = pTVar3 + (long)&tcg_ctx->pool_cur;
      local_40 = pTVar4 + (long)&tcg_ctx->pool_cur;
      tcg_gen_callN_sparc64
                (tcg_ctx,helper_ld_asi_sparc64,
                 (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[(uint)rd >> 1]),4,
                 &local_58);
    }
    else {
      if (size != 4) {
        iVar7 = 0xa2c;
        goto LAB_00a59681;
      }
      pTVar5 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I64,false);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = addr + (long)tcg_ctx;
      local_48 = pTVar3 + (long)tcg_ctx;
      local_40 = pTVar4 + (long)&tcg_ctx->pool_cur;
      tcg_gen_callN_sparc64(tcg_ctx,helper_ld_asi_sparc64,pTVar5,4,&local_58);
      ret = gen_dest_fpr_F(dc);
      tcg_gen_extrl_i64_i32_sparc64(tcg_ctx,ret,(TCGv_i64)((long)pTVar5 - (long)tcg_ctx));
      tcg_temp_free_internal_sparc64(tcg_ctx,pTVar5);
      gen_store_fpr_F(dc,rd,ret);
    }
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    return;
  case GET_ASI_BLOCK:
    if ((rd & 7U) != 0 || size != 8) {
LAB_00a592e0:
      gen_exception(dc,0x10);
      return;
    }
    if (dc->address_mask_32bit == true) {
      tcg_gen_andi_i64_sparc64(dc->uc->tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,0xffffffff);
    }
    pTVar2 = tcg_const_i64_sparc64(tcg_ctx,8);
    tcg_gen_qemu_ld_i64_sparc64
              (tcg_ctx,tcg_ctx->cpu_fpr[(uint)rd >> 1],(TCGv_i64)addr,(long)iVar7,
               memop | MO_ALIGN_64);
    pTVar5 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    lVar6 = 0;
    do {
      tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(addr + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(addr + (long)&tcg_ctx->pool_cur),(TCGArg)pTVar5);
      lVar1 = lVar6 + 1;
      lVar6 = lVar6 + 1;
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx,tcg_ctx->cpu_fpr[(ulong)((uint)rd >> 1) + lVar1],(TCGv_i64)addr,(long)iVar7
                 ,memop);
    } while (lVar6 != 7);
LAB_00a594cd:
    tcg_temp_free_internal_sparc64(tcg_ctx,pTVar5);
    return;
  case GET_ASI_SHORT:
    if (size != 8) goto LAB_00a592e0;
    if (dc->address_mask_32bit == true) {
      tcg_gen_andi_i64_sparc64(dc->uc->tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,0xffffffff);
    }
    pTVar2 = tcg_ctx->cpu_fpr[(uint)rd >> 1];
  }
  tcg_gen_qemu_ld_i64_sparc64(tcg_ctx,pTVar2,(TCGv_i64)addr,(long)iVar7,memop);
  return;
}

Assistant:

static void gen_ldf_asi(DisasContext *dc, TCGv addr,
                        int insn, int size, int rd)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    DisasASI da = get_asi(dc, insn, (size == 4 ? MO_TEUL : MO_TEQ));
    TCGv_i32 d32;
    TCGv_i64 d64;

    switch (da.type) {
    case GET_ASI_EXCP:
        break;

    case GET_ASI_DIRECT:
        gen_address_mask(dc, addr);
        switch (size) {
        case 4:
            d32 = gen_dest_fpr_F(dc);
            tcg_gen_qemu_ld_i32(tcg_ctx, d32, addr, da.mem_idx, da.memop);
            gen_store_fpr_F(dc, rd, d32);
            break;
        case 8:
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], addr, da.mem_idx,
                                da.memop | MO_ALIGN_4);
            break;
        case 16:
            d64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_qemu_ld_i64(tcg_ctx, d64, addr, da.mem_idx, da.memop | MO_ALIGN_4);
            tcg_gen_addi_tl(tcg_ctx, addr, addr, 8);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd/2+1], addr, da.mem_idx,
                                da.memop | MO_ALIGN_4);
            tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], d64);
            tcg_temp_free_i64(tcg_ctx, d64);
            break;
        default:
            g_assert_not_reached();
        }
        break;

    case GET_ASI_BLOCK:
        /* Valid for lddfa on aligned registers only.  */
        if (size == 8 && (rd & 7) == 0) {
            MemOp memop;
            TCGv eight;
            int i;

            gen_address_mask(dc, addr);

            /* The first operation checks required alignment.  */
            memop = da.memop | MO_ALIGN_64;
            eight = tcg_const_tl(tcg_ctx, 8);
            for (i = 0; ; ++i) {
                tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2 + i], addr,
                                    da.mem_idx, memop);
                if (i == 7) {
                    break;
                }
                tcg_gen_add_tl(tcg_ctx, addr, addr, eight);
                memop = da.memop;
            }
            tcg_temp_free(tcg_ctx, eight);
        } else {
            gen_exception(dc, TT_ILL_INSN);
        }
        break;

    case GET_ASI_SHORT:
        /* Valid for lddfa only.  */
        if (size == 8) {
            gen_address_mask(dc, addr);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], addr, da.mem_idx, da.memop);
        } else {
            gen_exception(dc, TT_ILL_INSN);
        }
        break;

    default:
        {
            TCGv_i32 r_asi = tcg_const_i32(tcg_ctx, da.asi);
            TCGv_i32 r_mop = tcg_const_i32(tcg_ctx, da.memop);

            save_state(dc);
            /* According to the table in the UA2011 manual, the only
               other asis that are valid for ldfa/lddfa/ldqfa are
               the NO_FAULT asis.  We still need a helper for these,
               but we can just use the integer asi helper for them.  */
            switch (size) {
            case 4:
                d64 = tcg_temp_new_i64(tcg_ctx);
                gen_helper_ld_asi(tcg_ctx, d64, tcg_ctx->cpu_env, addr, r_asi, r_mop);
                d32 = gen_dest_fpr_F(dc);
                tcg_gen_extrl_i64_i32(tcg_ctx, d32, d64);
                tcg_temp_free_i64(tcg_ctx, d64);
                gen_store_fpr_F(dc, rd, d32);
                break;
            case 8:
                gen_helper_ld_asi(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], tcg_ctx->cpu_env, addr, r_asi, r_mop);
                break;
            case 16:
                d64 = tcg_temp_new_i64(tcg_ctx);
                gen_helper_ld_asi(tcg_ctx, d64, tcg_ctx->cpu_env, addr, r_asi, r_mop);
                tcg_gen_addi_tl(tcg_ctx, addr, addr, 8);
                gen_helper_ld_asi(tcg_ctx, tcg_ctx->cpu_fpr[rd/2+1], tcg_ctx->cpu_env, addr, r_asi, r_mop);
                tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], d64);
                tcg_temp_free_i64(tcg_ctx, d64);
                break;
            default:
                g_assert_not_reached();
            }
            tcg_temp_free_i32(tcg_ctx, r_mop);
            tcg_temp_free_i32(tcg_ctx, r_asi);
        }
        break;
    }
}